

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

int __thiscall QDockAreaLayoutInfo::remove(QDockAreaLayoutInfo *this,char *__filename)

{
  long in_FS_OFFSET;
  QList<int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf(&local_38,this,(QWidget *)__filename);
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    remove(this,(char *)&local_38);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::remove(QWidget *widget)
{
    const QList<int> path = indexOf(widget);
    if (path.isEmpty())
        return;
    remove(path);
}